

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxIfStatement::Resolve(FxIfStatement *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  bool bVar2;
  int iVar3;
  FxExpression *pFVar4;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FScriptPosition *this_01;
  size_t size;
  FCompileContext *size_00;
  FxExpression *o;
  FxExpression *pFVar5;
  ExpVal condval;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->WhenFalse == (FxExpression *)0x0 && this->WhenTrue == (FxExpression *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this_01 = &(this->super_FxExpression).ScriptPosition;
    size = 0;
    FScriptPosition::Message(this_01,0,"empty if statement");
    pFVar4 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x28,size);
    FxNop::FxNop((FxNop *)pFVar4,this_01);
    return pFVar4;
  }
  if (this->Condition != (FxExpression *)0x0) {
    size_00 = ctx;
    iVar3 = (*this->Condition->_vptr_FxExpression[2])();
    pFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
    this->Condition = pFVar4;
    if (pFVar4 != (FxExpression *)0x0) {
      if (pFVar4->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size_00);
        FxBoolCast::FxBoolCast(this_00,this->Condition,false);
        this->Condition = (FxExpression *)this_00;
        iVar3 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
        this->Condition = (FxExpression *)CONCAT44(extraout_var_00,iVar3);
        if ((FxExpression *)CONCAT44(extraout_var_00,iVar3) == (FxExpression *)0x0)
        goto LAB_00518d71;
      }
      ppFVar1 = &this->WhenTrue;
      pFVar4 = *ppFVar1;
      if (pFVar4 != (FxExpression *)0x0) {
        iVar3 = (*pFVar4->_vptr_FxExpression[2])(pFVar4,ctx);
        *ppFVar1 = (FxExpression *)CONCAT44(extraout_var_01,iVar3);
        if ((FxExpression *)CONCAT44(extraout_var_01,iVar3) == (FxExpression *)0x0)
        goto LAB_00518d71;
      }
      pFVar4 = this->WhenFalse;
      if (pFVar4 != (FxExpression *)0x0) {
        iVar3 = (*pFVar4->_vptr_FxExpression[2])(pFVar4,ctx);
        this->WhenFalse = (FxExpression *)CONCAT44(extraout_var_02,iVar3);
        if ((FxExpression *)CONCAT44(extraout_var_02,iVar3) == (FxExpression *)0x0)
        goto LAB_00518d71;
      }
      (this->super_FxExpression).ValueType = &TypeVoid->super_PType;
      iVar3 = (*this->Condition->_vptr_FxExpression[3])();
      if ((char)iVar3 == '\0') {
        return &this->super_FxExpression;
      }
      o = this->Condition + 1;
      ExpVal::ExpVal(&condval,(ExpVal *)o);
      bVar2 = ExpVal::GetBool(&condval);
      pFVar5 = this->WhenTrue;
      pFVar4 = this->WhenFalse;
      if (bVar2) {
        pFVar5 = this->WhenFalse;
        pFVar4 = this->WhenTrue;
      }
      if (pFVar5 != (FxExpression *)0x0) {
        (*((FxExpression *)&pFVar5->_vptr_FxExpression)->_vptr_FxExpression[1])();
      }
      *ppFVar1 = (FxExpression *)0x0;
      this->WhenFalse = (FxExpression *)0x0;
      if (pFVar4 == (FxExpression *)0x0) {
        pFVar4 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x28,(size_t)o);
        FxNop::FxNop((FxNop *)pFVar4,&(this->super_FxExpression).ScriptPosition);
      }
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      ExpVal::~ExpVal(&condval);
      return pFVar4;
    }
  }
LAB_00518d71:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxIfStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();

	if (WhenTrue == nullptr && WhenFalse == nullptr)
	{ // We don't do anything either way, so disappear
		delete this;
		ScriptPosition.Message(MSG_WARNING, "empty if statement");
		return new FxNop(ScriptPosition);
	}

	SAFE_RESOLVE(Condition, ctx);

	if (Condition->ValueType != TypeBool)
	{
		Condition = new FxBoolCast(Condition, false);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (WhenTrue != nullptr)
	{
		WhenTrue = WhenTrue->Resolve(ctx);
		ABORT(WhenTrue);
	}
	if (WhenFalse != nullptr)
	{
		WhenFalse = WhenFalse->Resolve(ctx);
		ABORT(WhenFalse);
	}

	ValueType = TypeVoid;

	if (Condition->isConstant())
	{
		ExpVal condval = static_cast<FxConstant *>(Condition)->GetValue();
		bool result = condval.GetBool();

		FxExpression *e = result ? WhenTrue : WhenFalse;
		delete (result ? WhenFalse : WhenTrue);
		WhenTrue = WhenFalse = nullptr;
		if (e == nullptr) e = new FxNop(ScriptPosition);	// create a dummy if this statement gets completely removed by optimizing out the constant parts.
		delete this;
		return e;
	}

	return this;
}